

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  const_reference ppLVar2;
  int *piVar3;
  float *pfVar4;
  undefined8 *in_RCX;
  long in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float w_4;
  float val_3;
  int k_3;
  float *sptr_3;
  Mat m_3;
  int q_1;
  float *kptr_3;
  float sum_3;
  int j_4;
  int i_4;
  float *weight_data_ptr_1;
  float *outptr_3;
  int p_1;
  int g_5;
  int num_output_g;
  int channels_g;
  float w_3;
  float val_2;
  int k_2;
  float *sptr_2;
  float sum_2;
  int j_3;
  int i_3;
  Mat m_2;
  float *kptr_2;
  float *outptr_2;
  int g_4;
  Mat top_blob_g_1;
  Option opt_g_2;
  int g_3;
  char w_2;
  char val_1;
  int k_1;
  char *sptr_1;
  Mat m_1;
  int q;
  char *kptr_1;
  int sum_1;
  int j_2;
  int i_2;
  char *weight_data_ptr;
  int *outptr_1;
  int p;
  int g_2;
  int num_output_g_1;
  int channels_g_2;
  Mat top_blob_g;
  Option opt_g_1;
  char w_1;
  char val;
  int k;
  char *sptr;
  int sum;
  int j_1;
  int i_1;
  Mat m;
  char *kptr;
  int *outptr;
  int g_1;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_g;
  Option opt_g;
  int g;
  int channels_g_1;
  Mat bottom_blob_int8;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  allocator_type *in_stack_fffffffffffff9f0;
  size_type in_stack_fffffffffffff9f8;
  Mat *in_stack_fffffffffffffa00;
  int local_56c;
  Mat local_560;
  int local_524;
  float *local_520;
  float local_514;
  int local_510;
  int local_50c;
  float *local_508;
  Mat local_500;
  float *local_4c8;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  float local_4ac;
  float local_4a8;
  int local_4a4;
  float *local_4a0;
  float local_494;
  int local_490;
  int local_48c;
  Mat local_488;
  float *local_450;
  Mat local_448;
  float *local_410;
  int local_404;
  undefined1 local_400 [56];
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  int local_3a4;
  char local_39e;
  char local_39d;
  int local_39c;
  char *local_398;
  Mat local_390;
  int local_354;
  char *local_350;
  int local_344;
  int local_340;
  int local_33c;
  char *local_338;
  Mat local_330;
  int *local_2f8;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  undefined1 local_2e0 [56];
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined8 uStack_2a0;
  undefined8 local_298;
  char local_286;
  char local_285;
  int local_284;
  char *local_280;
  int local_274;
  int local_270;
  int local_26c;
  Mat local_268;
  char *local_230;
  Mat local_228;
  int *local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  reference local_1d0;
  vector<int,_std::allocator<int>_> local_1c0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  Mat local_190;
  undefined1 local_158 [56];
  undefined1 local_120 [56];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined8 local_d8;
  int local_d0;
  float in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int iVar5;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  Mat *in_stack_ffffffffffffff48;
  Mat *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff60;
  Allocator *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  Mat local_80;
  int local_48;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  long local_20;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  if ((local_34 % *(int *)(in_RDI + 0xac) != 0) ||
     (*(int *)(in_RDI + 0x80) % *(int *)(in_RDI + 0xac) != 0)) {
    return -100;
  }
  local_44 = *(int *)(in_RDI + 0x8c) * (*(int *)(in_RDI + 0x84) + -1) + 1;
  local_48 = *(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x88) + -1) + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Mat::Mat(&local_80,in_RSI);
  if (((*(byte *)(in_RDI + 0x198) & 1) != 0) && (local_40 != 1)) {
    Mat::Mat((Mat *)&stack0xffffffffffffff48);
    Mat::create(in_stack_fffffffffffffa00,(int)(in_stack_fffffffffffff9f8 >> 0x20),
                (int)in_stack_fffffffffffff9f8,(int)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                (Allocator *)in_stack_fffffffffffff9e0);
    bVar1 = Mat::empty(in_stack_fffffffffffff9e0);
    if (bVar1) {
      local_4 = -100;
      iVar5 = 1;
    }
    else {
      in_stack_ffffffffffffff34 = (float)(local_34 / *(int *)(in_RDI + 0xac));
      for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0xac); local_d0 = local_d0 + 1) {
        local_d8 = local_28[2];
        _local_e8 = CONCAT44(1,(int)*local_28);
        Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                           (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                           (int)in_stack_fffffffffffff9e0);
        Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                           (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                           (int)in_stack_fffffffffffff9e0);
        ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1a0),(long)local_d0);
        (*(*ppLVar2)->_vptr_Layer[5])(*ppLVar2,local_120,local_158,&local_e8);
        Mat::~Mat((Mat *)0x1634bc);
        Mat::~Mat((Mat *)0x1634c9);
      }
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                     in_stack_fffffffffffff9e0);
      iVar5 = 0;
    }
    Mat::~Mat((Mat *)0x163554);
    if (iVar5 != 0) goto LAB_00164c2c;
    in_stack_ffffffffffffff38 = 0;
  }
  Mat::Mat(&local_190,&local_80);
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    if ((*(int *)(in_RDI + 0x9c) == -0xe9) && (*(int *)(in_RDI + 0xa0) == -0xe9)) {
      local_194 = (local_44 + ((local_2c + -1) / *(int *)(in_RDI + 0x94)) * *(int *)(in_RDI + 0x94))
                  - local_2c;
      local_198 = (local_48 + ((local_30 + -1) / *(int *)(in_RDI + 0x98)) * *(int *)(in_RDI + 0x98))
                  - local_30;
      if ((0 < local_194) || (0 < local_198)) {
        in_stack_fffffffffffff9e0 = (Mat *)local_28[2];
        in_stack_fffffffffffff9e8 = *(undefined4 *)((long)local_28 + 4);
        copy_make_border(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                         in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff34,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
        bVar1 = Mat::empty(in_stack_fffffffffffff9e0);
        if (bVar1) {
          local_4 = -100;
          goto LAB_00164c0e;
        }
      }
      local_2c = local_190.w;
      local_30 = local_190.h;
    }
LAB_0016381c:
    local_19c = (local_2c - local_44) / *(int *)(in_RDI + 0x94) + 1;
    local_1a0 = (local_30 - local_48) / *(int *)(in_RDI + 0x98) + 1;
    Mat::create(in_stack_fffffffffffffa00,(int)(in_stack_fffffffffffff9f8 >> 0x20),
                (int)in_stack_fffffffffffff9f8,(int)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                (Allocator *)in_stack_fffffffffffff9e0);
    bVar1 = Mat::empty(in_stack_fffffffffffff9e0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_1a4 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
      std::allocator<int>::allocator((allocator<int> *)0x16392a);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa00,
                 in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
      std::allocator<int>::~allocator((allocator<int> *)0x163956);
      local_1d0 = std::vector<int,_std::allocator<int>_>::operator[](&local_1c0,0);
      local_1d4 = 0;
      local_1d8 = 0;
      local_1dc = local_2c * *(int *)(in_RDI + 0x90) -
                  *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x8c);
      for (local_1e0 = 0; local_1e0 < *(int *)(in_RDI + 0x88); local_1e0 = local_1e0 + 1) {
        for (local_1e4 = 0; local_1e4 < *(int *)(in_RDI + 0x84); local_1e4 = local_1e4 + 1) {
          local_1d0[local_1d4] = local_1d8;
          local_1d4 = local_1d4 + 1;
          local_1d8 = *(int *)(in_RDI + 0x8c) + local_1d8;
        }
        local_1d8 = local_1dc + local_1d8;
      }
      if ((*(byte *)(in_RDI + 0x198) & 1) == 0) {
        if ((local_34 == *(int *)(in_RDI + 0xac)) &&
           (*(int *)(in_RDI + 0xac) == *(int *)(in_RDI + 0x80))) {
          for (local_404 = 0; local_404 < *(int *)(in_RDI + 0xac); local_404 = local_404 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                         (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
            pfVar4 = Mat::operator_cast_to_float_(&local_448);
            Mat::~Mat((Mat *)0x16447b);
            local_410 = pfVar4;
            local_450 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xb8));
            local_450 = local_450 + local_1a4 * local_404;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                         (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
            for (local_48c = 0; local_48c < local_1a0; local_48c = local_48c + 1) {
              for (local_490 = 0; local_490 < local_19c; local_490 = local_490 + 1) {
                local_494 = 0.0;
                if (*(int *)(in_RDI + 0xa4) != 0) {
                  pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0xf0),local_404);
                  local_494 = *pfVar4;
                }
                local_4a0 = Mat::row(&local_488,local_48c * *(int *)(in_RDI + 0x98));
                local_4a0 = local_4a0 + local_490 * *(int *)(in_RDI + 0x94);
                for (local_4a4 = 0; local_4a4 < local_1a4; local_4a4 = local_4a4 + 1) {
                  local_4a8 = local_4a0[local_1d0[local_4a4]];
                  local_4ac = local_450[local_4a4];
                  local_494 = local_4a8 * local_4ac + local_494;
                }
                local_410[local_490] = local_494;
              }
              local_410 = local_410 + local_19c;
            }
            Mat::~Mat((Mat *)0x164739);
          }
        }
        else {
          local_4b0 = local_34 / *(int *)(in_RDI + 0xac);
          local_4b4 = *(int *)(in_RDI + 0x80) / *(int *)(in_RDI + 0xac);
          for (local_4b8 = 0; local_4b8 < *(int *)(in_RDI + 0xac); local_4b8 = local_4b8 + 1) {
            for (local_4bc = 0; local_4bc < local_4b4; local_4bc = local_4bc + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                           (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
              pfVar4 = Mat::operator_cast_to_float_(&local_500);
              Mat::~Mat((Mat *)0x164832);
              local_4c8 = pfVar4;
              local_508 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xb8));
              local_508 = local_508 + local_1a4 * local_4b0 * local_4b4 * local_4b8;
              for (local_50c = 0; local_50c < local_1a0; local_50c = local_50c + 1) {
                for (local_510 = 0; local_510 < local_19c; local_510 = local_510 + 1) {
                  local_514 = 0.0;
                  if (*(int *)(in_RDI + 0xa4) != 0) {
                    pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0xf0),
                                             local_4b4 * local_4b8 + local_4bc);
                    local_514 = *pfVar4;
                  }
                  local_520 = local_508 + local_1a4 * local_4b0 * local_4bc;
                  for (local_524 = 0; local_524 < local_4b0; local_524 = local_524 + 1) {
                    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8
                                                ),(int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
                    in_stack_fffffffffffff9f0 =
                         (allocator_type *)Mat::row(&local_560,local_50c * *(int *)(in_RDI + 0x98));
                    for (local_56c = 0; local_56c < local_1a4; local_56c = local_56c + 1) {
                      local_514 = *(float *)(in_stack_fffffffffffff9f0 +
                                            (long)local_1d0[local_56c] * 4 +
                                            (long)(local_510 * *(int *)(in_RDI + 0x94)) * 4) *
                                  local_520[local_56c] + local_514;
                    }
                    local_520 = local_520 + local_1a4;
                    Mat::~Mat((Mat *)0x164b29);
                  }
                  local_4c8[local_510] = local_514;
                }
                local_4c8 = local_4c8 + local_19c;
              }
            }
          }
        }
      }
      else if ((local_34 == *(int *)(in_RDI + 0xac)) &&
              (*(int *)(in_RDI + 0xac) == *(int *)(in_RDI + 0x80))) {
        for (local_1e8 = 0; local_1e8 < *(int *)(in_RDI + 0xac); local_1e8 = local_1e8 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                       (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
          piVar3 = Mat::operator_cast_to_int_(&local_228);
          Mat::~Mat((Mat *)0x163b5a);
          local_1f0 = piVar3;
          local_230 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0xb8));
          local_230 = local_230 + local_1a4 * local_1e8;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                       (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
          for (local_26c = 0; local_26c < local_1a0; local_26c = local_26c + 1) {
            for (local_270 = 0; local_270 < local_19c; local_270 = local_270 + 1) {
              local_274 = 0;
              local_280 = Mat::row<signed_char>(&local_268,local_26c * *(int *)(in_RDI + 0x98));
              local_280 = local_280 + local_270 * *(int *)(in_RDI + 0x94);
              for (local_284 = 0; local_284 < local_1a4; local_284 = local_284 + 1) {
                local_285 = local_280[local_1d0[local_284]];
                local_286 = local_230[local_284];
                local_274 = (int)local_285 * (int)local_286 + local_274;
              }
              local_1f0[local_270] = local_274;
            }
            local_1f0 = local_1f0 + local_19c;
          }
          local_298 = local_28[2];
          _local_2a8 = CONCAT44(1,(int)*local_28);
          uStack_2a0 = *(undefined8 *)(local_20 + 0x18);
          Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                             (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                             (int)in_stack_fffffffffffff9e0);
          ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x1b8),(long)local_1e8);
          (*(*ppLVar2)->_vptr_Layer[7])(*ppLVar2,local_2e0,&local_2a8);
          Mat::~Mat((Mat *)0x163e62);
          Mat::~Mat((Mat *)0x163e6f);
        }
      }
      else {
        local_2e4 = local_34 / *(int *)(in_RDI + 0xac);
        local_2e8 = *(int *)(in_RDI + 0x80) / *(int *)(in_RDI + 0xac);
        for (local_2ec = 0; local_2ec < *(int *)(in_RDI + 0xac); local_2ec = local_2ec + 1) {
          for (local_2f0 = 0; local_2f0 < local_2e8; local_2f0 = local_2f0 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                         (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
            piVar3 = Mat::operator_cast_to_int_(&local_330);
            Mat::~Mat((Mat *)0x163f85);
            local_2f8 = piVar3;
            local_338 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0xb8));
            local_338 = local_338 + local_1a4 * local_2e4 * local_2e8 * local_2ec;
            for (local_33c = 0; local_33c < local_1a0; local_33c = local_33c + 1) {
              for (local_340 = 0; local_340 < local_19c; local_340 = local_340 + 1) {
                local_344 = 0;
                local_350 = local_338 + local_1a4 * local_2e4 * local_2f0;
                for (local_354 = 0; local_354 < local_2e4; local_354 = local_354 + 1) {
                  Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                               (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
                  local_398 = Mat::row<signed_char>(&local_390,local_33c * *(int *)(in_RDI + 0x98));
                  local_398 = local_398 + local_340 * *(int *)(in_RDI + 0x94);
                  for (local_39c = 0; local_39c < local_1a4; local_39c = local_39c + 1) {
                    local_39d = local_398[local_1d0[local_39c]];
                    local_39e = local_350[local_39c];
                    local_344 = (int)local_39d * (int)local_39e + local_344;
                  }
                  local_350 = local_350 + local_1a4;
                  Mat::~Mat((Mat *)0x164206);
                }
                local_2f8[local_340] = local_344;
              }
              local_2f8 = local_2f8 + local_19c;
            }
          }
        }
        for (local_3a4 = 0; local_3a4 < *(int *)(in_RDI + 0xac); local_3a4 = local_3a4 + 1) {
          local_3b8 = local_28[2];
          _local_3c8 = CONCAT44(1,(int)*local_28);
          uStack_3c0 = *(undefined8 *)(local_20 + 0x18);
          Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                             (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                             (int)in_stack_fffffffffffff9e0);
          ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x1b8),(long)local_3a4);
          (*(*ppLVar2)->_vptr_Layer[7])(*ppLVar2,local_400,&local_3c8);
          Mat::~Mat((Mat *)0x164388);
        }
      }
      local_4 = 0;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9f0);
    }
  }
  else {
    in_stack_fffffffffffff9e0 = (Mat *)local_28[2];
    in_stack_fffffffffffff9e8 = *(undefined4 *)((long)local_28 + 4);
    copy_make_border(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff34,in_stack_ffffffffffffff68,
                     in_stack_ffffffffffffff70);
    bVar1 = Mat::empty(in_stack_fffffffffffff9e0);
    if (!bVar1) {
      local_2c = local_190.w;
      local_30 = local_190.h;
      goto LAB_0016381c;
    }
    local_4 = -100;
  }
LAB_00164c0e:
  Mat::~Mat((Mat *)0x164c1b);
LAB_00164c2c:
  Mat::~Mat((Mat *)0x164c39);
  return local_4;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    if (use_int8_inference)
    {
        // depth-wise
        if (channels == group && group == num_output)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                int* outptr = top_blob.channel(g);
                const signed char* kptr = (const signed char*)weight_data + maxk * g;
                const Mat m = bottom_blob_bordered.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            signed char val = sptr[ space_ofs[k] ];
                            signed char w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // dequantize, reverse scale inplace
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(g, 1);
                    dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
                }
            }
        }
        else
        {
            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

#ifdef _WIN32
            #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
            #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
            for (int g=0; g<group; g++)
            {
                for (int p=0; p<num_output_g; p++)
                {
                    int* outptr = top_blob.channel(g * num_output_g + p);
                    const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                            // channels_g
                            for (int q=0; q<channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                                for (int k = 0; k < maxk; k++)
                                {
                                    signed char val = sptr[ space_ofs[k] ];
                                    signed char w = kptr[k];
                                    sum += val * w;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = sum;
                        }

                        outptr += outw;
                    }
                }
            }

            // dequantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                ncnn::Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);
                dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
            }
        }

        return 0;
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

#ifdef _WIN32
    #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
    #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
    for (int g=0; g<group; g++)
    {
        for (int p=0; p<num_output_g; p++)
        {
            float* outptr = top_blob.channel(g * num_output_g + p);
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[num_output_g * g + p];

                    const float* kptr = weight_data_ptr + maxk * channels_g * p;

                    // channels_g
                    for (int q=0; q<channels_g; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }

    return 0;
}